

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmainct.c
# Opt level: O0

void process_data_simple_main
               (j_compress_ptr cinfo,JSAMPARRAY input_buf,JDIMENSION *in_row_ctr,
               JDIMENSION in_rows_avail)

{
  jpeg_c_main_controller *pjVar1;
  boolean bVar2;
  my_main_ptr_conflict main;
  JDIMENSION in_rows_avail_local;
  JDIMENSION *in_row_ctr_local;
  JSAMPARRAY input_buf_local;
  j_compress_ptr cinfo_local;
  
  pjVar1 = cinfo->main;
  while( true ) {
    if (cinfo->total_iMCU_rows <= *(uint *)&pjVar1[1].start_pass) {
      return;
    }
    if (*(uint *)((long)&pjVar1[1].start_pass + 4) < (uint)cinfo->min_DCT_v_scaled_size) {
      (*cinfo->prep->pre_process_data)
                (cinfo,input_buf,in_row_ctr,in_rows_avail,(JSAMPIMAGE)(pjVar1 + 2),
                 (JDIMENSION *)((long)&pjVar1[1].start_pass + 4),cinfo->min_DCT_v_scaled_size);
    }
    if (*(int *)((long)&pjVar1[1].start_pass + 4) != cinfo->min_DCT_v_scaled_size) break;
    bVar2 = (*cinfo->coef->compress_data)(cinfo,(JSAMPIMAGE)(pjVar1 + 2));
    if (bVar2 == 0) {
      if (*(int *)&pjVar1[1].process_data != 0) {
        return;
      }
      *in_row_ctr = *in_row_ctr - 1;
      *(undefined4 *)&pjVar1[1].process_data = 1;
      return;
    }
    if (*(int *)&pjVar1[1].process_data != 0) {
      *in_row_ctr = *in_row_ctr + 1;
      *(undefined4 *)&pjVar1[1].process_data = 0;
    }
    *(undefined4 *)((long)&pjVar1[1].start_pass + 4) = 0;
    *(int *)&pjVar1[1].start_pass = *(int *)&pjVar1[1].start_pass + 1;
  }
  return;
}

Assistant:

METHODDEF(void)
process_data_simple_main (j_decompress_ptr cinfo,
			  JSAMPARRAY output_buf, JDIMENSION *out_row_ctr,
			  JDIMENSION out_rows_avail)
{
  my_main_ptr main = (my_main_ptr) cinfo->main;
  JDIMENSION rowgroups_avail;

  /* Read input data if we haven't filled the main buffer yet */
  if (! main->buffer_full) {
    if (! (*cinfo->coef->decompress_data) (cinfo, main->buffer))
      return;			/* suspension forced, can do nothing more */
    main->buffer_full = TRUE;	/* OK, we have an iMCU row to work with */
  }

  /* There are always min_DCT_scaled_size row groups in an iMCU row. */
  rowgroups_avail = (JDIMENSION) cinfo->min_DCT_v_scaled_size;
  /* Note: at the bottom of the image, we may pass extra garbage row groups
   * to the postprocessor.  The postprocessor has to check for bottom
   * of image anyway (at row resolution), so no point in us doing it too.
   */

  /* Feed the postprocessor */
  (*cinfo->post->post_process_data) (cinfo, main->buffer,
				     &main->rowgroup_ctr, rowgroups_avail,
				     output_buf, out_row_ctr, out_rows_avail);

  /* Has postprocessor consumed all the data yet? If so, mark buffer empty */
  if (main->rowgroup_ctr >= rowgroups_avail) {
    main->buffer_full = FALSE;
    main->rowgroup_ctr = 0;
  }
}